

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O0

void __thiscall
amrex::FabCopyDescriptor<amrex::FArrayBox>::FabCopyDescriptor
          (FabCopyDescriptor<amrex::FArrayBox> *this)

{
  Box *in_RDI;
  
  (in_RDI->smallend).vect[0] = 0;
  (in_RDI->smallend).vect[1] = 0;
  Box::Box(in_RDI);
  in_RDI[1].smallend.vect[2] = -1;
  in_RDI[1].bigend.vect[0] = -1;
  in_RDI[1].bigend.vect[1] = -1;
  in_RDI[1].bigend.vect[2] = -1;
  in_RDI[1].btype.itype = 0xffffffff;
  in_RDI[2].smallend.vect[0] = -1;
  in_RDI[2].smallend.vect[1] = -1;
  in_RDI[2].smallend.vect[2] = 2;
  *(undefined1 *)in_RDI[2].bigend.vect = 0;
  return;
}

Assistant:

FabCopyDescriptor<FAB>::FabCopyDescriptor ()
    :
    localFabSource(0),
    myProc(-1),
    copyFromProc(-1),
    copyFromIndex(-1),
    fillBoxId(-1),
    srcComp(-1),
    destComp(-1),
    nComp(-1),
    fillType(Unfillable),
    cacheDataAllocated(false)
{}